

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void ravi_code_typecoersion(LexState *ls,int reg,ravi_type_map tm,TString *typename)

{
  uint bc;
  OpCode o;
  FuncState *pFVar1;
  
  if ((int)tm < 0x80) {
    if ((int)tm < 0x20) {
      if ((tm != 8) && (tm != 0x10)) {
        return;
      }
      pFVar1 = ls->fs;
      o = (tm == 0x10) + OP_RAVI_TOINT;
    }
    else {
      if ((tm != 0x20) && (tm != 0x40)) {
        return;
      }
      pFVar1 = ls->fs;
      o = (tm != 0x20) + OP_RAVI_TOIARRAY;
    }
  }
  else if ((int)tm < 0x201) {
    if (tm == 0x80) {
      pFVar1 = ls->fs;
      o = OP_RAVI_TOTAB;
    }
    else {
      if (tm != 0x101) {
        return;
      }
      pFVar1 = ls->fs;
      o = OP_RAVI_TOSTRING;
    }
  }
  else {
    if (tm != 0x201) {
      if (tm != 0x401) {
        return;
      }
      pFVar1 = ls->fs;
      bc = luaK_stringK(pFVar1,typename);
      luaK_codeABx(pFVar1,OP_RAVI_TOTYPE,reg,bc);
      return;
    }
    pFVar1 = ls->fs;
    o = OP_RAVI_TOCLOSURE;
  }
  luaK_codeABC(pFVar1,o,reg,0,0);
  return;
}

Assistant:

static void ravi_code_typecoersion(LexState *ls, int reg, ravi_type_map tm,
                                   TString *typename /* only if tt is USERDATA */) {
  /* do we need to convert ? */
  if (tm == RAVI_TM_FLOAT || tm == RAVI_TM_INTEGER)
    /* code an instruction to convert in place */
    luaK_codeABC(ls->fs, tm == RAVI_TM_FLOAT ? OP_RAVI_TOFLT : OP_RAVI_TOINT, reg, 0, 0);
  else if (tm == RAVI_TM_INTEGER_ARRAY || tm == RAVI_TM_FLOAT_ARRAY)
    luaK_codeABC(ls->fs, tm == RAVI_TM_INTEGER_ARRAY ? OP_RAVI_TOIARRAY : OP_RAVI_TOFARRAY, reg, 0, 0);
  else if (tm == RAVI_TM_TABLE)
    luaK_codeABC(ls->fs, OP_RAVI_TOTAB, reg, 0, 0);
  else if (tm == RAVI_TM_USERDATA_OR_NIL)
    luaK_codeABx(ls->fs, OP_RAVI_TOTYPE, reg, luaK_stringK(ls->fs, typename));
  else if (tm == RAVI_TM_STRING_OR_NIL)
    luaK_codeABC(ls->fs, OP_RAVI_TOSTRING, reg, 0, 0);
  else if (tm == RAVI_TM_FUNCTION_OR_NIL)
    luaK_codeABC(ls->fs, OP_RAVI_TOCLOSURE, reg, 0, 0);
  // TODO coerse to boolean
}